

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info.cc
# Opt level: O2

Abbrev * __thiscall bloaty::dwarf::DIEReader::ReadCode(DIEReader *this,CU *cu)

{
  bool bVar1;
  uint code;
  Abbrev *in_RAX;
  Abbrev *ret;
  Abbrev *local_18;
  
  local_18 = in_RAX;
  SkipNullEntries(this);
  if ((this->remaining_)._M_len == 0) {
    local_18 = (Abbrev *)0x0;
  }
  else {
    code = ReadLEB128<unsigned_int>(&this->remaining_);
    bVar1 = AbbrevTable::GetAbbrev(cu->unit_abbrev_,code,&local_18);
    if (!bVar1) {
      Throw("couldn\'t find abbreviation for code",0x10a);
    }
    if (local_18->has_child == true) {
      this->depth_ = this->depth_ + 1;
    }
  }
  return local_18;
}

Assistant:

const AbbrevTable::Abbrev* DIEReader::ReadCode(const CU& cu) {
  SkipNullEntries();
  if (remaining_.empty()) {
    return nullptr;
  }
  uint32_t code = ReadLEB128<uint32_t>(&remaining_);
  const AbbrevTable::Abbrev* ret;
  if (!cu.unit_abbrev_->GetAbbrev(code, &ret)) {
    THROW("couldn't find abbreviation for code");
  }
  if (ret->has_child) {
    depth_++;
  }
  return ret;
}